

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::PointRenderCase::genGeometrySource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  ostream *poVar1;
  char *pcVar2;
  char *pcVar3;
  ostringstream buf;
  ostream oStack_198;
  
  pcVar3 = "vtx_color";
  if (*(char *)((long)this + 0x80) != '\0') {
    pcVar3 = "tess_color";
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oStack_198);
  poVar1 = std::operator<<(&oStack_198,"${GLSL_VERSION_DECL}\n${GEOMETRY_SHADER_REQUIRE}\n");
  pcVar2 = glcts::fixed_sample_locations_values + 1;
  if (*(char *)((long)this + 0xd8) != '\0') {
    pcVar2 = "${GEOMETRY_POINT_SIZE}\n";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,
                           "layout(points) in;\nlayout(max_vertices=3, points) out;\n\nin highp vec4 "
                          );
  poVar1 = std::operator<<(poVar1,pcVar3);
  poVar1 = std::operator<<(poVar1,
                           "[1];\nout highp vec4 geo_color;\nuniform highp vec4 u_posScale;\n\nflat in highp vec3 v_geo_bbox_clipMin[1];\nflat in highp vec3 v_geo_bbox_clipMax[1];\nflat out highp vec3 v_bbox_clipMin;\nflat out highp vec3 v_bbox_clipMax;\nflat out highp float v_bbox_expansionSize;\n\n"
                          );
  poVar1 = std::operator<<(poVar1,
                           "vec4 mirrorX(in highp vec4 p)\n{\n\thighp vec2 patternOffset = u_posScale.xy;\n\thighp vec2 patternScale = u_posScale.zw;\n\thighp vec2 patternCenter = patternOffset + patternScale * 0.5;\n\treturn vec4(2.0 * patternCenter.x - p.x, p.y, p.z, p.w);\n}\n"
                          );
  poVar1 = std::operator<<(poVar1,
                           "\nvoid main()\n{\n\t// Non-trivial geometry shader: 1-to-3 amplification, mirror horizontally\n\thighp vec4 p0 = mirrorX(gl_in[0].gl_Position);\n\thighp vec4 pointColor = "
                          );
  poVar1 = std::operator<<(poVar1,pcVar3);
  poVar1 = std::operator<<(poVar1,
                           "[0];\n\thighp vec2 patternScale = u_posScale.zw;\n\thighp float pointSize = "
                          );
  pcVar3 = "1.0";
  if (*(char *)((long)this + 0xd8) != '\0') {
    pcVar3 = "(pointColor.g > 0.0) ? (5.0) : (3.0)";
  }
  poVar1 = std::operator<<(poVar1,pcVar3);
  std::operator<<(poVar1,
                  ";\n\n\thighp vec4 offsets[3] =\n\t\tvec4[3](\n\t\t\tvec4( 0.05 * patternScale.x, 0.03 * patternScale.y, 0.0, 0.0),\n\t\t\tvec4(-0.01 * patternScale.x,-0.02 * patternScale.y, 0.0, 0.0),\n\t\t\tvec4(-0.05 * patternScale.x, 0.02 * patternScale.y, 0.0, 0.0)\n\t\t);\n\tfor (int ndx = 0; ndx < 3; ++ndx)\n\t{\n\t\tgl_Position = p0 + offsets[ndx];\n"
                 );
  if (*(char *)((long)this + 0xd8) == '\x01') {
    std::operator<<(&oStack_198,"\t\tgl_PointSize = pointSize;\n");
  }
  std::operator<<(&oStack_198,
                  "\t\tv_bbox_clipMin = v_geo_bbox_clipMin[0];\n\t\tv_bbox_clipMax = v_geo_bbox_clipMax[0];\n\t\tv_bbox_expansionSize = pointSize;\n\t\tgeo_color = pointColor;\n\t\tEmitVertex();\n\t}\n}\n"
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string PointRenderCase::genGeometrySource (void) const
{
	const char* const	colorInputName = (m_hasTessellationStage) ? ("tess_color") : ("vtx_color");
	std::ostringstream	buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"${GEOMETRY_SHADER_REQUIRE}\n"
		<<	((m_isWidePointCase) ? ("${GEOMETRY_POINT_SIZE}\n") : (""))
		<<	"layout(points) in;\n"
			"layout(max_vertices=3, points) out;\n"
			"\n"
			"in highp vec4 " << colorInputName << "[1];\n"
			"out highp vec4 geo_color;\n"
			"uniform highp vec4 u_posScale;\n"
			"\n"
			"flat in highp vec3 v_geo_bbox_clipMin[1];\n"
			"flat in highp vec3 v_geo_bbox_clipMax[1];\n"
			"flat out highp vec3 v_bbox_clipMin;\n"
			"flat out highp vec3 v_bbox_clipMax;\n"
			"flat out highp float v_bbox_expansionSize;\n"
			"\n"
		<<	genShaderFunction(SHADER_FUNC_MIRROR_X)
		<<	"\n"
			"void main()\n"
			"{\n"
			"	// Non-trivial geometry shader: 1-to-3 amplification, mirror horizontally\n"
			"	highp vec4 p0 = mirrorX(gl_in[0].gl_Position);\n"
			"	highp vec4 pointColor = " << colorInputName << "[0];\n"
			"	highp vec2 patternScale = u_posScale.zw;\n"
			"	highp float pointSize = "
				<< (m_isWidePointCase ? ("(pointColor.g > 0.0) ? (5.0) : (3.0)") : ("1.0"))
				<< ";\n"
			"\n"
			"	highp vec4 offsets[3] =\n"
			"		vec4[3](\n"
			"			vec4( 0.05 * patternScale.x, 0.03 * patternScale.y, 0.0, 0.0),\n"
			"			vec4(-0.01 * patternScale.x,-0.02 * patternScale.y, 0.0, 0.0),\n"
			"			vec4(-0.05 * patternScale.x, 0.02 * patternScale.y, 0.0, 0.0)\n"
			"		);\n"
			"	for (int ndx = 0; ndx < 3; ++ndx)\n"
			"	{\n"
			"		gl_Position = p0 + offsets[ndx];\n";

	if (m_isWidePointCase)
		buf <<	"		gl_PointSize = pointSize;\n";

	buf <<	"		v_bbox_clipMin = v_geo_bbox_clipMin[0];\n"
			"		v_bbox_clipMax = v_geo_bbox_clipMax[0];\n"
			"		v_bbox_expansionSize = pointSize;\n"
			"		geo_color = pointColor;\n"
			"		EmitVertex();\n"
			"	}\n"
			"}\n";

	return buf.str();
}